

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::GenerateHashCode
          (ImmutableEnumOneofFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  Printer *printer_local;
  ImmutableEnumOneofFieldGenerator *this_local;
  
  descriptor = FieldDescriptor::file((this->super_ImmutableEnumFieldGenerator).descriptor_);
  bVar1 = SupportUnknownEnumValue(descriptor);
  if (bVar1) {
    io::Printer::Print(printer,&(this->super_ImmutableEnumFieldGenerator).variables_,
                       "hash = (37 * hash) + $constant_name$;\nhash = (53 * hash) + get$capitalized_name$Value();\n"
                      );
  }
  else {
    io::Printer::Print(printer,&(this->super_ImmutableEnumFieldGenerator).variables_,
                       "hash = (37 * hash) + $constant_name$;\nhash = (53 * hash) + get$capitalized_name$().getNumber();\n"
                      );
  }
  return;
}

Assistant:

void ImmutableEnumOneofFieldGenerator::
GenerateHashCode(io::Printer* printer) const {
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
      "hash = (37 * hash) + $constant_name$;\n"
      "hash = (53 * hash) + get$capitalized_name$Value();\n");
  } else {
    printer->Print(variables_,
      "hash = (37 * hash) + $constant_name$;\n"
      "hash = (53 * hash) + get$capitalized_name$().getNumber();\n");
  }
}